

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O3

bool __thiscall
QCborValueConstRef::comparesEqual_helper
          (QCborValueConstRef *this,QCborValueConstRef lhs,QCborValue *rhs)

{
  anon_union_8_2_4ee71171_for_Element_0 *paVar1;
  int iVar2;
  long in_FS_OFFSET;
  Element local_38;
  anon_union_8_2_4ee71171_for_Element_0 local_28;
  anon_union_8_2_4ee71171_for_Element_0 aStack_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  paVar1 = (anon_union_8_2_4ee71171_for_Element_0 *)
           (&(this[3].d)->super_QSharedData + (long)lhs.d * 4);
  local_28 = *paVar1;
  aStack_20 = paVar1[1];
  local_38 = QCborContainerPrivate::elementFromValue((QCborValue *)lhs.i);
  iVar2 = compareElementRecursive
                    ((QCborContainerPrivate *)this,(Element *)&local_28,
                     ((QCborValue *)lhs.i)->container,&local_38,ForEquality);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2 == 0;
  }
  __stack_chk_fail();
}

Assistant:

bool
QCborValueConstRef::comparesEqual_helper(QCborValueConstRef lhs, const QCborValue &rhs) noexcept
{
    QtCbor::Element e1 = lhs.d->elements.at(lhs.i);
    QtCbor::Element e2 = QCborContainerPrivate::elementFromValue(rhs);
    return compareElementRecursive(lhs.d, e1, rhs.container, e2, Comparison::ForEquality) == 0;
}